

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintdevice.cpp
# Opt level: O0

double __thiscall
QPaintDevice::getDecodedMetricF
          (QPaintDevice *this,PaintDeviceMetric metricA,PaintDeviceMetric metricB)

{
  undefined4 uVar1;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  double res;
  qint32 buf [2];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  uVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_ESI);
  *(undefined4 *)((long)&local_10 + (ulong)(in_ESI & 1) * 4) = uVar1;
  uVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_EDX);
  *(undefined4 *)((long)&local_10 + (ulong)(in_EDX & 1) * 4) = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (double)local_10;
  }
  __stack_chk_fail();
}

Assistant:

double QPaintDevice::getDecodedMetricF(PaintDeviceMetric metricA, PaintDeviceMetric metricB) const
{
    qint32 buf[2];
    // The Encoded metric enum values come in pairs of one odd and one even value.
    // We map those to the 0 and 1 indexes of buf by taking just the least significant bit.
    // Same mapping here as in the encodeMetricF() function, to ensure correct order.
    buf[metricA & 1] = metric(metricA);
    buf[metricB & 1] = metric(metricB);
    double res;
    memcpy(&res, buf, sizeof(res));
    return res;
}